

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

TermList __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::InstMatcher::derefQueryBinding(InstMatcher *this,uint var)

{
  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  DerefTask elem;
  DerefTask elem_00;
  DerefTask *pDVar1;
  bool bVar2;
  int iVar3;
  TermList val_00;
  TermList *pTVar4;
  TermList key;
  VariableIterator *key_00;
  TermList tvar;
  TermSpec varBinding;
  TermList derefBoundTerm;
  undefined1 local_b0 [16];
  undefined1 uStack_a0;
  uint7 uStack_9f;
  Entry *local_98;
  Entry *local_90;
  undefined1 uStack_88;
  undefined7 uStack_87;
  uint64_t local_80;
  TermList val;
  TermList **local_58;
  
  key._content._0_4_ = var * 4 + 1;
  key._content._4_4_ = 0;
  varBinding.q = false;
  varBinding.t._content = 2;
  val._content = 2;
  this_00 = &this->_derefBindings;
  tvar._content = key._content;
  bVar2 = Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                    (this_00,&tvar,&val);
  if (!bVar2) {
    Lib::
    DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::find(&this->_bindings,&tvar,&varBinding);
    bVar2 = TermSpec::isFinal(&varBinding);
    if (!bVar2) {
      if ((SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
           ::InstMatcher::derefQueryBinding(unsigned_int)::toDo == '\0') &&
         (iVar3 = __cxa_guard_acquire(&SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
                                       ::InstMatcher::derefQueryBinding(unsigned_int)::toDo),
         iVar3 != 0)) {
        derefQueryBinding::toDo._cursor = (DerefTask *)0x0;
        derefQueryBinding::toDo._end = (DerefTask *)0x0;
        derefQueryBinding::toDo._capacity = 0;
        derefQueryBinding::toDo._stack = (DerefTask *)0x0;
        __cxa_atexit(Lib::
                     Stack<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::InstMatcher::DerefTask>
                     ::~Stack,&derefQueryBinding::toDo,&__dso_handle);
        __cxa_guard_release(&SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
                             ::InstMatcher::derefQueryBinding(unsigned_int)::toDo);
      }
      derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._stack;
      do {
        bVar2 = TermSpec::isFinal(&varBinding);
        if ((bVar2) || ((varBinding.t._content & 3) == 0)) {
          bVar2 = TermSpec::isFinal(&varBinding);
          if (bVar2) {
            Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
            insert(this_00,tvar,varBinding.t);
          }
          else {
            local_90 = (Entry *)tvar._content;
            uStack_88 = varBinding.q;
            local_80 = varBinding.t._content;
            elem.trm._1_7_ = uStack_87;
            elem.trm.q = varBinding.q;
            elem.var._content = tvar._content;
            elem.trm.t._content = varBinding.t._content;
            Lib::
            Stack<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::InstMatcher::DerefTask>
            ::push(&derefQueryBinding::toDo,elem);
            Kernel::VariableIterator::VariableIterator((VariableIterator *)&val,varBinding.t);
            while (bVar2 = Kernel::VariableIterator::hasNext((VariableIterator *)&val), bVar2) {
              derefBoundTerm._content = local_58[-1]->_content;
              if (((varBinding.q != false) || (((uint)derefBoundTerm._content & 3) == 3)) &&
                 (Lib::
                  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  find((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)local_b0,(TermList *)this_00), local_b0._0_8_ == 0)) {
                local_b0._8_8_ = derefBoundTerm._content;
                uStack_a0 = 0;
                local_98 = (Entry *)0x2;
                elem_00.trm._0_8_ = (ulong)uStack_9f << 8;
                elem_00.var._content = derefBoundTerm._content;
                elem_00.trm.t._content = 2;
                Lib::
                Stack<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::InstMatcher::DerefTask>
                ::push(&derefQueryBinding::toDo,elem_00);
              }
            }
            Kernel::VariableIterator::~VariableIterator((VariableIterator *)&val);
          }
          while( true ) {
            if (derefQueryBinding::toDo._cursor == derefQueryBinding::toDo._stack)
            goto LAB_00323b28;
            if ((derefQueryBinding::toDo._cursor[-1].trm.t._content & 3) == 2) break;
            tvar._content = derefQueryBinding::toDo._cursor[-1].var._content;
            pDVar1 = derefQueryBinding::toDo._cursor + -1;
            val._content = CONCAT71(val._content._1_7_,derefQueryBinding::toDo._cursor[-1].trm.q) &
                           0xffffffffffffff01;
            derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._cursor + -1;
            val_00 = Kernel::SubstHelper::
                     applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>::InstMatcher::DerefApplicator>
                               ((pDVar1->trm).t._content,(DerefApplicator *)&val,false);
            Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
            insert(this_00,tvar,val_00);
          }
          if (derefQueryBinding::toDo._cursor == derefQueryBinding::toDo._stack) {
LAB_00323b28:
            pTVar4 = Lib::
                     DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                     ::get(this_00,key);
            return (TermList)pTVar4->_content;
          }
          tvar._content = derefQueryBinding::toDo._cursor[-1].var._content;
          key_00 = (VariableIterator *)&tvar;
          derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._cursor + -1;
        }
        else {
          val = varBinding.t;
          derefBoundTerm._content = 2;
          bVar2 = Lib::
                  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  find(this_00,&val,&derefBoundTerm);
          key_00 = (VariableIterator *)&val;
          if (bVar2) {
            Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
            insert(this_00,tvar,derefBoundTerm);
          }
        }
        Lib::
        DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::find(&this->_bindings,(TermList *)key_00,&varBinding);
      } while( true );
    }
    Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (this_00,tvar,varBinding.t);
    val = varBinding.t;
  }
  return (TermList)val._content;
}

Assistant:

TermList SubstitutionTree<LeafData_>::InstMatcher::derefQueryBinding(unsigned var)
{
  TermList tvar0(var, false);
  TermList tvar=tvar0;

  TermSpec varBinding;
  {
    TermList val;
    if(_derefBindings.find(tvar, val)) {
      return val;
    }
    //only bound values can be passed to this function
    ALWAYS(_bindings.find(tvar, varBinding));

    if(varBinding.isFinal()) {
      ALWAYS(_derefBindings.insert(tvar, varBinding.t));
      return varBinding.t;
    }
  }
  static Stack<DerefTask> toDo;
  toDo.reset();

  for(;;) {
    while(!varBinding.isFinal() && !varBinding.t.isTerm()) {
      ASS(varBinding.t.isVar());
      ASS(!varBinding.q || !varBinding.t.isOrdinaryVar());


      TermList bvar=varBinding.t;
      TermList derefBoundTerm;

      if(_derefBindings.find(bvar, derefBoundTerm)) {
	ALWAYS(_derefBindings.insert(tvar, derefBoundTerm));
      }

      ALWAYS(_bindings.find(bvar,varBinding));
    }
    if(varBinding.isFinal()) {
      ALWAYS(_derefBindings.insert(tvar, varBinding.t));
      goto next_loop;
    }
    {
      ASS(varBinding.t.isTerm());
      toDo.push(DerefTask(tvar, varBinding));
      VariableIterator vit(varBinding.t);
      while(vit.hasNext()) {
	TermList btv=vit.next(); //bound term variable
	if(varBinding.q || btv.isSpecialVar()) {
	  ASS(_bindings.find(btv));
	  if(!_derefBindings.find(btv)) {
	    toDo.push(DerefTask(btv));
	  }
	}
      }
    }
    next_loop:
    while(toDo.isNonEmpty() && toDo.top().buildDerefTerm()) {
      tvar=toDo.top().var;
      TermSpec tspec=toDo.pop().trm;
      DerefApplicator applicator(this, tspec.q);
      TermList derefTerm=SubstHelper::applySV(tspec.t, applicator);
      ASS_REP(!derefTerm.isTerm() || derefTerm.term()->shared(), derefTerm);
      ALWAYS(_derefBindings.insert(tvar, derefTerm));
    }
    if(toDo.isEmpty()) {
      break;
    }
    tvar=toDo.pop().var;
    ALWAYS(_bindings.find(tvar, varBinding));
  };
  return _derefBindings.get(tvar0);
}